

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

bool __thiscall Memory::Recycler::DoQueueTrackedObject(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  CollectionState CVar4;
  undefined4 *puVar5;
  Recycler *this_local;
  
  if (((this->queueTrackedObject & 1U) == 0) && (BVar3 = IsConcurrentMarkState(this), BVar3 != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x8f2,"(this->queueTrackedObject || !this->IsConcurrentMarkState())",
                       "this->queueTrackedObject || !this->IsConcurrentMarkState()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if ((((this->queueTrackedObject & 1U) == 0) && ((this->isProcessingTrackedObjects & 1U) == 0)) &&
     (bVar2 = HasPendingTrackObjects(this), bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x8f3,
                       "(this->queueTrackedObject || this->isProcessingTrackedObjects || !this->HasPendingTrackObjects())"
                       ,
                       "this->queueTrackedObject || this->isProcessingTrackedObjects || !this->HasPendingTrackObjects()"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if ((((this->queueTrackedObject & 1U) == 0) && ((this->inPartialCollectMode & 1U) == 0)) &&
     (CVar4 = ObservableValue::operator_cast_to_CollectionState
                        ((ObservableValue *)&this->collectionState),
     CVar4 == CollectionStateParallelMark)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x8f5,
                       "(this->queueTrackedObject || this->inPartialCollectMode || !(this->collectionState == CollectionStateParallelMark))"
                       ,
                       "this->queueTrackedObject || this->inPartialCollectMode || !(this->collectionState == CollectionStateParallelMark)"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (((this->queueTrackedObject & 1U) != 0) &&
     ((bVar2 = SListBase<void_*,_Memory::ArenaAllocator,_RealCount>::Empty
                         (&this->clientTrackedObjectList), !bVar2 ||
      ((this->inPartialCollectMode & 1U) != 0)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x8f6,
                       "(!this->queueTrackedObject || (this->clientTrackedObjectList.Empty() && !this->inPartialCollectMode))"
                       ,
                       "!this->queueTrackedObject || (this->clientTrackedObjectList.Empty() && !this->inPartialCollectMode)"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  return (bool)(this->queueTrackedObject & 1);
}

Assistant:

bool
Recycler::DoQueueTrackedObject() const
{
    Assert(this->queueTrackedObject || !this->IsConcurrentMarkState());
    Assert(this->queueTrackedObject || this->isProcessingTrackedObjects || !this->HasPendingTrackObjects());
#if ENABLE_PARTIAL_GC
    Assert(this->queueTrackedObject || this->inPartialCollectMode || !(this->collectionState == CollectionStateParallelMark));
    Assert(!this->queueTrackedObject || (this->clientTrackedObjectList.Empty() && !this->inPartialCollectMode));
#else
    Assert(this->queueTrackedObject || !(this->collectionState == CollectionStateParallelMark));
#endif
    return this->queueTrackedObject;
}